

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::DrawAndBlit(FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1680))(this->m_po);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1d93);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo_1st);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1d96);
  (**(code **)(lVar4 + 0x1a00))(0,0,8);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1d99);
  (**(code **)(lVar4 + 0xd8))(this->m_vao_stencil_pass_quad);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1d9d);
  (**(code **)(lVar4 + 0x12c8))(0x200,0,0xff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilFunc call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1da0);
  (**(code **)(lVar4 + 0x12e8))(0x1e02,0x1e00);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilOp call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1da3);
  (**(code **)(lVar4 + 0x12d8))(0xff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1da6);
  (**(code **)(lVar4 + 0x238))(0,0,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glColorMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1da9);
  (**(code **)(lVar4 + 0x4a8))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDepthMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dac);
  (**(code **)(lVar4 + 0x5e0))(0xb90);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1daf);
  (**(code **)(lVar4 + 0x4e8))(0xb71);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1db2);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1db5);
  (**(code **)(lVar4 + 0xd8))(this->m_vao_depth_pass_quad);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1db9);
  (**(code **)(lVar4 + 0x12c8))(0x207,0,0xff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilFunc call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dbc);
  (**(code **)(lVar4 + 0x12e8))(0x1e00,0x1e00);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilOp call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dbf);
  (**(code **)(lVar4 + 0x12d8))(0xff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dc2);
  (**(code **)(lVar4 + 0x4a0))(0x207);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDepthFunc call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dc5);
  (**(code **)(lVar4 + 0x4e8))(0xb90);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDisable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dc8);
  (**(code **)(lVar4 + 0x5e0))(0xb71);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dcb);
  (**(code **)(lVar4 + 0x4a8))(1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDepthMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dce);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dd1);
  (**(code **)(lVar4 + 0xd8))(this->m_vao_color_pass_quad);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dd5);
  (**(code **)(lVar4 + 0x238))(1,1,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glColorMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dd8);
  (**(code **)(lVar4 + 0x12c8))(0x202,1,0xff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glStencilFunc call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1ddb);
  (**(code **)(lVar4 + 0x5e0))(0xb90);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dde);
  (**(code **)(lVar4 + 0x5e0))(0xb71);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1de1);
  (**(code **)(lVar4 + 0x4a0))(0x204);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDepthFunc call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1de4);
  (**(code **)(lVar4 + 0x4a8))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDepthMask call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1de7);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1dea);
  (**(code **)(lVar4 + 0x148))(this->m_fbo_1st,this->m_fbo_2nd,0,0,8,8,0,0,4,3,0x4000,0x2600);
  iVar1 = (**(code **)(lVar4 + 0x800))();
  return iVar1 == 0;
}

Assistant:

bool FunctionalTest::DrawAndBlit()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_1st);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.viewport(0, 0, 8, 8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	/* Draw to stencil buffer. */
	gl.bindVertexArray(m_vao_stencil_pass_quad);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.stencilFunc(GL_NEVER, 0, 0xff);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilFunc call failed.");

	gl.stencilOp(GL_INCR, GL_KEEP, GL_KEEP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilOp call failed.");

	gl.stencilMask(0xff);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilMask call failed.");

	gl.colorMask(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glColorMask call failed.");

	gl.depthMask(GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthMask call failed.");

	gl.enable(GL_STENCIL_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl.disable(GL_DEPTH_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* Draw to depth buffer. */
	gl.bindVertexArray(m_vao_depth_pass_quad);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.stencilFunc(GL_ALWAYS, 0, 0xff);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilFunc call failed.");

	gl.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilOp call failed.");

	gl.stencilMask(0xff);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilMask call failed.");

	gl.depthFunc(GL_ALWAYS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthFunc call failed.");

	gl.disable(GL_STENCIL_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable call failed.");

	gl.enable(GL_DEPTH_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl.depthMask(GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthMask call failed.");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* Draw to color buffer. */
	gl.bindVertexArray(m_vao_color_pass_quad);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glColorMask call failed.");

	gl.stencilFunc(GL_EQUAL, 1, 0xff);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilFunc call failed.");

	gl.enable(GL_STENCIL_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl.enable(GL_DEPTH_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl.depthFunc(GL_GREATER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthFunc call failed.");

	gl.depthMask(GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthMask call failed.");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* Blit framebuffer content. */
	gl.blitNamedFramebuffer(m_fbo_1st, m_fbo_2nd, 0, 0, 8, 8, 0, 0, 4, 3, GL_COLOR_BUFFER_BIT, GL_NEAREST);

	if (gl.getError())
	{
		return false;
	}

	return true;
}